

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_loading_thread.c
# Opt level: O1

void * loading_thread(ALLEGRO_THREAD *thread,void *arg)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ALLEGRO_BITMAP *pAVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar5 = al_load_font("data/fixed_font.tga",0,0);
  fVar9 = 255.0;
  uVar7 = al_map_rgb_f(0x437f0000,0x437f0000,0x437f0000);
  load_count = 0;
  fVar10 = fVar9;
  do {
    uVar2 = rand();
    uVar3 = rand();
    uVar4 = rand();
    fVar8 = (float)al_map_rgb(uVar2 & 0xff,uVar3 & 0xff,uVar4 & 0xff);
    fVar11 = fVar10;
    bVar1 = al_get_thread_should_stop(thread);
    if (bVar1 == 0) {
      pAVar6 = (ALLEGRO_BITMAP *)al_load_bitmap("data/mysha.pcx");
      al_set_target_bitmap(pAVar6);
      al_draw_filled_rectangle(0,0,0x43a00000,0x43480000,fVar8 * 0.25,fVar10 * 0.25);
      fVar11 = fVar9;
      al_draw_textf(uVar7,fVar9,0,0,uVar5,0,"bitmap %d",load_count + 1);
      al_set_target_bitmap(0);
      al_lock_mutex(mutex);
      bitmaps[load_count] = pAVar6;
      load_count = load_count + 1;
      al_unlock_mutex(mutex);
      al_rest(0x9999999a);
    }
    fVar10 = fVar11;
  } while ((bVar1 | 99 < load_count) != 1);
  al_destroy_font(uVar5);
  return arg;
}

Assistant:

static void *loading_thread(ALLEGRO_THREAD *thread, void *arg)
{
   ALLEGRO_FONT *font;
   ALLEGRO_COLOR text;

   font = al_load_font("data/fixed_font.tga", 0, 0);
   text = al_map_rgb_f(255, 255, 255);

   /* In this example we load mysha.pcx 100 times to simulate loading
    * many bitmaps.
    */
   load_count = 0;
   while (load_count < load_total) {
      ALLEGRO_COLOR color;
      ALLEGRO_BITMAP *bmp;

      color = al_map_rgb(rand() % 256, rand() % 256, rand() % 256);
      color.r /= 4;
      color.g /= 4;
      color.b /= 4;
      color.a /= 4;

      if (al_get_thread_should_stop(thread))
         break;

      bmp = al_load_bitmap("data/mysha.pcx");

      /* Simulate different contents. */
      al_set_target_bitmap(bmp);
      al_draw_filled_rectangle(0, 0, 320, 200, color);
      al_draw_textf(font, text, 0, 0, 0, "bitmap %d", 1 + load_count);
      al_set_target_bitmap(NULL);

      /* Allow the main thread to see the completed bitmap. */
      al_lock_mutex(mutex);
      bitmaps[load_count] = bmp;
      load_count++;
      al_unlock_mutex(mutex);

      /* Simulate that it's slow. */
      al_rest(0.05);
   }
   
   al_destroy_font(font); 
   return arg;
}